

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  undefined4 *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000b8;
  int in_stack_000000c4;
  int *sing;
  int *rperm;
  int *idx;
  int lk;
  int rs;
  int len;
  int p_col;
  int p_row;
  int r;
  int ll;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffe18;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffe20;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe40;
  undefined1 local_170 [80];
  long local_120;
  long local_118;
  long local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  reference local_68;
  cpp_dec_float<100U,_int,_void> *local_60;
  reference local_58;
  reference local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  reference local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  reference local_10;
  undefined1 *local_8;
  
  local_88 = &local_e0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffe20);
  local_118 = *(long *)(in_RDI + 0x6a);
  local_120 = *(long *)(in_RDI + 0xd2);
  local_104 = in_RDI[0xdc];
  for (local_e4 = 0; local_e4 < (int)in_RDI[1]; local_e4 = local_e4 + 1) {
    if ((*(int *)(local_118 + (long)local_e4 * 4) < 0) &&
       (*(int *)(*(long *)(in_RDI + 0xac) + (long)local_e4 * 4) == 1)) {
      iVar1 = in_RDI[0xdc];
      in_RDI[0xdc] = iVar1 + 1;
      *(int *)(local_120 + (long)iVar1 * 4) = local_e4;
    }
  }
  do {
    if ((int)in_RDI[0xdc] <= local_104) {
      return;
    }
    local_f8 = *(int *)(local_120 + (long)local_104 * 4);
    local_e8 = *(int *)(*(long *)(in_RDI + 0xaa) + (long)local_f8 * 4);
    local_fc = *(int *)(*(long *)(in_RDI + 0xa8) + (long)local_e8 * 4);
    local_50 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)(in_RDI + 0xa2),(long)local_e8);
    local_48 = &local_e0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_78 = local_170;
    local_80 = &local_e0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    setPivot((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)rperm,sing._4_4_,(int)sing,in_stack_000000c4,in_stack_000000b8);
    *(undefined4 *)(*(long *)(in_RDI + 0xac) + (long)local_f8 * 4) = 0;
    local_110 = *(long *)(in_RDI + 0xba) +
                (long)*(int *)(*(long *)(in_RDI + 0xc2) + (long)local_fc * 4) * 4;
    local_e4 = *(int *)(*(long *)(in_RDI + 0xda) + (long)local_fc * 4);
    local_108 = makeLvec(in_stack_fffffffffffffe40,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    local_100 = *(int *)(*(long *)(in_RDI + 0xc4) + (long)local_fc * 4);
    local_e4 = *(int *)(*(long *)(in_RDI + 0xc4) + (long)local_fc * 4) - local_e4;
    *(int *)(*(long *)(in_RDI + 0xc4) + (long)local_fc * 4) = local_e4;
    for (; local_e4 < local_100; local_e4 = local_e4 + 1) {
      local_f4 = *(int *)(local_110 + (long)local_e4 * 4);
      if (local_f4 != local_f8) {
        local_f0 = *(int *)(*(long *)(in_RDI + 0xac) + (long)local_f4 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0xac) + (long)local_f4 * 4) = local_f0;
        local_ec = *(int *)(*(long *)(in_RDI + 0xaa) + (long)local_f4 * 4) + local_f0;
        local_e8 = local_ec;
        while (*(int *)(*(long *)(in_RDI + 0xa8) + (long)local_e8 * 4) != local_fc) {
          local_e8 = local_e8 + -1;
        }
        *(int *)(*(long *)(in_RDI + 0x78) + (long)local_108 * 4) = local_f4;
        local_30 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xa2),(long)local_e8);
        local_28 = &stack0xfffffffffffffe40;
        local_38 = &local_e0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30,local_38);
        local_20 = &stack0xfffffffffffffe40;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffffe20);
        local_8 = &stack0xfffffffffffffe40;
        local_10 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   (cpp_dec_float<100U,_int,_void> *)0x53636a);
        local_68 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0x72),(long)local_108);
        local_70 = &stack0xfffffffffffffe40;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_108 = local_108 + 1;
        *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)local_e8 * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)local_ec * 4);
        in_stack_fffffffffffffe20 =
             &std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)(in_RDI + 0xa2),(long)local_ec)->m_backend;
        local_58 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xa2),(long)local_e8);
        local_60 = in_stack_fffffffffffffe20;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        if (local_f0 == 1) {
          iVar1 = in_RDI[0xdc];
          in_RDI[0xdc] = iVar1 + 1;
          *(int *)(local_120 + (long)iVar1 * 4) = local_f4;
        }
        else if (local_f0 == 0) {
          *in_RDI = 2;
          return;
        }
      }
    }
    local_104 = local_104 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}